

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathTranslateFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  byte bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  int iVar5;
  xmlXPathObjectPtr pxVar6;
  xmlXPathObjectPtr pxVar7;
  xmlBufPtr buf;
  byte *utf;
  xmlChar *val;
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr *ppxVar8;
  xmlXPathObjectPtr pxVar9;
  uint uVar10;
  ulong uVar11;
  byte *utfchar;
  unsigned_long opCount;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 3) {
    iVar4 = 0xc;
LAB_001bfe8a:
    xmlXPathErr(ctxt,iVar4);
    return;
  }
  uVar10 = ctxt->valueNr;
  if ((int)uVar10 < 3) {
    iVar4 = 0x17;
    goto LAB_001bfe8a;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type == XPATH_STRING)) {
    uVar3 = uVar10 - 1;
    ctxt->valueNr = uVar3;
    ppxVar8 = ctxt->valueTab;
LAB_001bfeb5:
    uVar11 = (ulong)uVar3;
    pxVar7 = ppxVar8[(ulong)uVar10 - 2];
LAB_001bfebe:
    ctxt->value = pxVar7;
    uVar10 = (uint)uVar11;
    pxVar7 = ppxVar8[uVar11];
    ppxVar8[uVar11] = (xmlXPathObjectPtr)0x0;
  }
  else {
    xmlXPathStringFunction(ctxt,1);
    uVar10 = ctxt->valueNr;
    uVar11 = 0;
    if (0 < (int)uVar10) {
      uVar3 = uVar10 - 1;
      ctxt->valueNr = uVar3;
      ppxVar8 = ctxt->valueTab;
      if (uVar10 != 1) goto LAB_001bfeb5;
      pxVar7 = (xmlXPathObjectPtr)0x0;
      goto LAB_001bfebe;
    }
    pxVar7 = (xmlXPathObjectPtr)0x0;
  }
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
    uVar10 = ctxt->valueNr;
  }
  if ((int)uVar10 < 1) {
    pxVar6 = (xmlXPathObjectPtr)0x0;
  }
  else {
    uVar3 = uVar10 - 1;
    ctxt->valueNr = uVar3;
    ppxVar8 = ctxt->valueTab;
    if (uVar10 == 1) {
      pxVar6 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar6 = ppxVar8[(ulong)uVar10 - 2];
    }
    ctxt->value = pxVar6;
    pxVar6 = ppxVar8[uVar3];
    ppxVar8[uVar3] = (xmlXPathObjectPtr)0x0;
    uVar10 = uVar3;
  }
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
    uVar10 = ctxt->valueNr;
  }
  if ((int)uVar10 < 1) {
    pxVar9 = (xmlXPathObjectPtr)0x0;
  }
  else {
    uVar3 = uVar10 - 1;
    ctxt->valueNr = uVar3;
    ppxVar8 = ctxt->valueTab;
    if (uVar10 == 1) {
      pxVar9 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar9 = ppxVar8[(ulong)uVar10 - 2];
    }
    ctxt->value = pxVar9;
    pxVar9 = ppxVar8[uVar3];
    ppxVar8[uVar3] = (xmlXPathObjectPtr)0x0;
  }
  if (ctxt->error == 0) {
    if (ctxt->context->opLimit != 0) {
      iVar4 = xmlStrlen(pxVar6->stringval);
      iVar5 = xmlStrlen(pxVar9->stringval);
      if ((iVar4 != 0) && (iVar5 != 0)) {
        uVar11 = (ulong)(long)iVar5 / 10 + 1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar11;
        opCount = ((ulong)(long)iVar4 / 10 + 1) * uVar11;
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) <=
            (ulong)(long)iVar4 / 10) {
          opCount = 0xffffffffffffffff;
        }
        iVar4 = xmlXPathCheckOpLimit(ctxt,opCount);
        if (iVar4 < 0) goto LAB_001c0146;
      }
    }
    buf = xmlBufCreate(0x32);
    if (buf == (xmlBufPtr)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    else {
      iVar4 = xmlUTF8Strlen(pxVar7->stringval);
      utfchar = pxVar9->stringval;
      do {
        bVar1 = *utfchar;
        if (bVar1 == 0) goto LAB_001c00fa;
        iVar5 = xmlUTF8Strloc(pxVar6->stringval,utfchar);
        utf = utfchar;
        if ((iVar5 < 0) ||
           ((iVar5 < iVar4 && (utf = xmlUTF8Strpos(pxVar7->stringval,iVar5), utf != (byte *)0x0))))
        {
          iVar5 = xmlUTF8Strsize(utf,1);
          xmlBufAdd(buf,utf,(long)iVar5);
        }
        utfchar = utfchar + 1;
      } while ((-1 < (char)bVar1) || (((~bVar1 & 0xc0) == 0 && ((bVar1 & 0x40) == 0))));
      xmlXPathErr(ctxt,0x15);
LAB_001c00fa:
      val = xmlBufDetach(buf);
      if (val == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      else {
        value = xmlXPathCacheWrapString(ctxt,val);
        xmlXPathValuePush(ctxt,value);
      }
      xmlBufFree(buf);
    }
  }
LAB_001c0146:
  xmlXPathReleaseObject(ctxt->context,pxVar9);
  xmlXPathReleaseObject(ctxt->context,pxVar6);
  xmlXPathReleaseObject(ctxt->context,pxVar7);
  return;
}

Assistant:

void
xmlXPathTranslateFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str = NULL;
    xmlXPathObjectPtr from = NULL;
    xmlXPathObjectPtr to = NULL;
    xmlBufPtr target;
    int offset, max;
    int ch;
    const xmlChar *point;
    xmlChar *cptr, *content;

    CHECK_ARITY(3);

    CAST_TO_STRING;
    to = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    from = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    str = xmlXPathValuePop(ctxt);
    if (ctxt->error != 0)
        goto error;

    /*
     * Account for quadratic runtime
     */
    if (ctxt->context->opLimit != 0) {
        unsigned long f1 = xmlStrlen(from->stringval);
        unsigned long f2 = xmlStrlen(str->stringval);

        if ((f1 > 0) && (f2 > 0)) {
            unsigned long p;

            f1 = f1 / 10 + 1;
            f2 = f2 / 10 + 1;
            p = f1 > ULONG_MAX / f2 ? ULONG_MAX : f1 * f2;
            if (xmlXPathCheckOpLimit(ctxt, p) < 0)
                goto error;
        }
    }

    target = xmlBufCreate(50);
    if (target == NULL) {
        xmlXPathPErrMemory(ctxt);
        goto error;
    }

    max = xmlUTF8Strlen(to->stringval);
    for (cptr = str->stringval; (ch=*cptr); ) {
        offset = xmlUTF8Strloc(from->stringval, cptr);
        if (offset >= 0) {
            if (offset < max) {
                point = xmlUTF8Strpos(to->stringval, offset);
                if (point)
                    xmlBufAdd(target, point, xmlUTF8Strsize(point, 1));
            }
        } else
            xmlBufAdd(target, cptr, xmlUTF8Strsize(cptr, 1));

        /* Step to next character in input */
        cptr++;
        if ( ch & 0x80 ) {
            /* if not simple ascii, verify proper format */
            if ( (ch & 0xc0) != 0xc0 ) {
                xmlXPathErr(ctxt, XPATH_INVALID_CHAR_ERROR);
                break;
            }
            /* then skip over remaining bytes for this char */
            while ( (ch <<= 1) & 0x80 )
                if ( (*cptr++ & 0xc0) != 0x80 ) {
                    xmlXPathErr(ctxt, XPATH_INVALID_CHAR_ERROR);
                    break;
                }
            if (ch & 0x80) /* must have had error encountered */
                break;
        }
    }

    content = xmlBufDetach(target);
    if (content == NULL)
        xmlXPathPErrMemory(ctxt);
    else
        xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, content));
    xmlBufFree(target);
error:
    xmlXPathReleaseObject(ctxt->context, str);
    xmlXPathReleaseObject(ctxt->context, from);
    xmlXPathReleaseObject(ctxt->context, to);
}